

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 (*pauVar28) [16];
  uint uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  byte bVar33;
  ulong uVar34;
  RTCIntersectArguments *pRVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined4 uVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1324;
  ulong local_1320;
  ulong local_1318;
  RayHit *local_1310;
  ulong local_1308;
  RTCIntersectArguments *local_1300;
  long local_12f8;
  long local_12f0;
  Scene *local_12e8;
  RTCFilterFunctionNArguments local_12e0;
  float local_12b0;
  undefined4 local_12ac;
  undefined4 local_12a8;
  undefined4 local_12a4;
  undefined4 local_12a0;
  undefined4 local_129c;
  uint local_1298;
  uint local_1294;
  uint local_1290;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar2;
  float fVar3;
  undefined1 auVar47 [16];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar40 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar50 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar51 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar45._8_4_ = 0x7fffffff;
    auVar45._0_8_ = 0x7fffffff7fffffff;
    auVar45._12_4_ = 0x7fffffff;
    auVar45 = vandps_avx512vl((undefined1  [16])aVar4,auVar45);
    auVar46._8_4_ = 0x219392ef;
    auVar46._0_8_ = 0x219392ef219392ef;
    auVar46._12_4_ = 0x219392ef;
    uVar36 = vcmpps_avx512vl(auVar45,auVar46,1);
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = 0x3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar45 = vdivps_avx(auVar100,(undefined1  [16])aVar4);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar11 = (bool)((byte)uVar36 & 1);
    auVar47._0_4_ = (uint)bVar11 * auVar46._0_4_ | (uint)!bVar11 * auVar45._0_4_;
    bVar11 = (bool)((byte)(uVar36 >> 1) & 1);
    auVar47._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar45._4_4_;
    bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
    auVar47._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar45._8_4_;
    bVar11 = (bool)((byte)(uVar36 >> 3) & 1);
    auVar47._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar45._12_4_;
    auVar48._8_4_ = 0x3f7ffffa;
    auVar48._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar48._12_4_ = 0x3f7ffffa;
    auVar48 = vmulps_avx512vl(auVar47,auVar48);
    auVar49._8_4_ = 0x3f800003;
    auVar49._0_8_ = 0x3f8000033f800003;
    auVar49._12_4_ = 0x3f800003;
    auVar49 = vmulps_avx512vl(auVar47,auVar49);
    local_1230 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar114 = ZEXT1664(local_1230);
    local_1240 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar115 = ZEXT1664(local_1240);
    local_1250 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar116 = ZEXT1664(local_1250);
    local_1260 = vbroadcastss_avx512vl(auVar48);
    auVar117 = ZEXT1664(local_1260);
    auVar45 = vmovshdup_avx(auVar48);
    local_1270 = vshufps_avx512vl(auVar48,auVar48,0x55);
    auVar118 = ZEXT1664(local_1270);
    auVar46 = vshufpd_avx(auVar48,auVar48,1);
    local_1280 = vshufps_avx512vl(auVar48,auVar48,0xaa);
    auVar119 = ZEXT1664(local_1280);
    fVar90 = auVar49._0_4_;
    local_1200 = vshufps_avx(auVar49,auVar49,0x55);
    auVar111 = ZEXT1664(local_1200);
    local_1210 = vshufps_avx(auVar49,auVar49,0xaa);
    auVar112 = ZEXT1664(local_1210);
    uVar36 = (ulong)(auVar48._0_4_ < 0.0) << 4;
    uVar37 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x20;
    uVar34 = (ulong)(auVar46._0_4_ < 0.0) << 4 | 0x40;
    uVar39 = uVar36 ^ 0x10;
    uVar42 = uVar37 ^ 0x10;
    uVar94 = auVar50._0_4_;
    local_1220._4_4_ = uVar94;
    local_1220._0_4_ = uVar94;
    local_1220._8_4_ = uVar94;
    local_1220._12_4_ = uVar94;
    auVar113 = ZEXT1664(local_1220);
    uVar94 = auVar51._0_4_;
    auVar93 = ZEXT1664(CONCAT412(uVar94,CONCAT48(uVar94,CONCAT44(uVar94,uVar94))));
    local_1310 = ray;
    local_1318 = uVar36;
    local_1320 = uVar37;
    local_11f0 = fVar90;
    fStack_11ec = fVar90;
    fStack_11e8 = fVar90;
    fStack_11e4 = fVar90;
    local_1308 = uVar39;
    fVar107 = fVar90;
    fVar108 = fVar90;
    fVar109 = fVar90;
LAB_01be26f2:
    if (pauVar40 != (undefined1 (*) [16])&local_fa0) {
      pauVar28 = pauVar40 + -1;
      pauVar40 = pauVar40 + -1;
      if (*(float *)((long)*pauVar28 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar43 = *(ulong *)*pauVar40;
        while ((uVar43 & 8) == 0) {
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar36),auVar114._0_16_);
          auVar45 = vmulps_avx512vl(auVar117._0_16_,auVar45);
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar37),auVar115._0_16_);
          auVar50 = vmulps_avx512vl(auVar118._0_16_,auVar50);
          auVar45 = vmaxps_avx(auVar45,auVar50);
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar34),auVar116._0_16_);
          auVar50 = vmulps_avx512vl(auVar119._0_16_,auVar50);
          auVar50 = vmaxps_avx(auVar50,auVar113._0_16_);
          auVar45 = vmaxps_avx(auVar45,auVar50);
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar39),auVar114._0_16_);
          auVar51._0_4_ = fVar90 * auVar50._0_4_;
          auVar51._4_4_ = fVar107 * auVar50._4_4_;
          auVar51._8_4_ = fVar108 * auVar50._8_4_;
          auVar51._12_4_ = fVar109 * auVar50._12_4_;
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar42),auVar115._0_16_);
          auVar97._0_4_ = auVar111._0_4_ * auVar50._0_4_;
          auVar97._4_4_ = auVar111._4_4_ * auVar50._4_4_;
          auVar97._8_4_ = auVar111._8_4_ * auVar50._8_4_;
          auVar97._12_4_ = auVar111._12_4_ * auVar50._12_4_;
          auVar50 = vminps_avx(auVar51,auVar97);
          auVar51 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar34 ^ 0x10)),
                                    auVar116._0_16_);
          auVar98._0_4_ = auVar112._0_4_ * auVar51._0_4_;
          auVar98._4_4_ = auVar112._4_4_ * auVar51._4_4_;
          auVar98._8_4_ = auVar112._8_4_ * auVar51._8_4_;
          auVar98._12_4_ = auVar112._12_4_ * auVar51._12_4_;
          auVar51 = vminps_avx(auVar98,auVar93._0_16_);
          auVar50 = vminps_avx(auVar50,auVar51);
          uVar44 = vcmpps_avx512vl(auVar45,auVar50,2);
          local_1180._0_16_ = auVar45;
          if ((char)uVar44 == '\0') goto LAB_01be26f2;
          uVar41 = uVar43 & 0xfffffffffffffff0;
          lVar21 = 0;
          for (uVar43 = uVar44; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar21 = lVar21 + 1;
          }
          uVar43 = *(ulong *)(uVar41 + lVar21 * 8);
          uVar31 = (uint)uVar44 - 1 & (uint)uVar44;
          uVar44 = (ulong)uVar31;
          if (uVar31 != 0) {
            uVar29 = *(uint *)(local_1180 + lVar21 * 4);
            lVar21 = 0;
            for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar32 = (ulong)uVar31;
            uVar44 = *(ulong *)(uVar41 + lVar21 * 8);
            uVar38 = *(uint *)(local_1180 + lVar21 * 4);
            if (uVar31 == 0) {
              if (uVar29 < uVar38) {
                *(ulong *)*pauVar40 = uVar44;
                *(uint *)((long)*pauVar40 + 8) = uVar38;
                pauVar40 = pauVar40 + 1;
              }
              else {
                *(ulong *)*pauVar40 = uVar43;
                *(uint *)((long)*pauVar40 + 8) = uVar29;
                pauVar40 = pauVar40 + 1;
                uVar43 = uVar44;
              }
            }
            else {
              auVar50._8_8_ = 0;
              auVar50._0_8_ = uVar43;
              auVar45 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar29));
              auVar95._8_8_ = 0;
              auVar95._0_8_ = uVar44;
              auVar50 = vpunpcklqdq_avx(auVar95,ZEXT416(uVar38));
              lVar21 = 0;
              for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                lVar21 = lVar21 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              uVar43 = (ulong)uVar31;
              auVar96._8_8_ = 0;
              auVar96._0_8_ = *(ulong *)(uVar41 + lVar21 * 8);
              auVar49 = vpunpcklqdq_avx(auVar96,ZEXT416(*(uint *)(local_1180 + lVar21 * 4)));
              auVar51 = vpshufd_avx(auVar45,0xaa);
              auVar46 = vpshufd_avx(auVar50,0xaa);
              auVar48 = vpshufd_avx(auVar49,0xaa);
              if (uVar31 == 0) {
                uVar43 = vpcmpgtd_avx512vl(auVar46,auVar51);
                uVar43 = uVar43 & 0xf;
                auVar46 = vpblendmd_avx512vl(auVar50,auVar45);
                bVar11 = (bool)((byte)uVar43 & 1);
                auVar52._0_4_ = (uint)bVar11 * auVar46._0_4_ | (uint)!bVar11 * auVar51._0_4_;
                bVar11 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar52._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar51._4_4_;
                bVar11 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar52._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar51._8_4_;
                bVar11 = SUB81(uVar43 >> 3,0);
                auVar52._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar51._12_4_;
                auVar50 = vmovdqa32_avx512vl(auVar50);
                bVar11 = (bool)((byte)uVar43 & 1);
                auVar53._0_4_ = (uint)bVar11 * auVar50._0_4_ | (uint)!bVar11 * auVar45._0_4_;
                bVar11 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar53._4_4_ = (uint)bVar11 * auVar50._4_4_ | (uint)!bVar11 * auVar45._4_4_;
                bVar11 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar53._8_4_ = (uint)bVar11 * auVar50._8_4_ | (uint)!bVar11 * auVar45._8_4_;
                bVar11 = SUB81(uVar43 >> 3,0);
                auVar53._12_4_ = (uint)bVar11 * auVar50._12_4_ | (uint)!bVar11 * auVar45._12_4_;
                auVar45 = vpshufd_avx(auVar52,0xaa);
                uVar44 = vpcmpgtd_avx512vl(auVar48,auVar45);
                uVar44 = uVar44 & 0xf;
                auVar50 = vpblendmd_avx512vl(auVar49,auVar52);
                bVar11 = (bool)((byte)uVar44 & 1);
                bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                uVar43 = CONCAT44((uint)bVar12 * auVar50._4_4_ | (uint)!bVar12 * auVar45._4_4_,
                                  (uint)bVar11 * auVar50._0_4_ | (uint)!bVar11 * auVar45._0_4_);
                auVar45 = vmovdqa32_avx512vl(auVar49);
                bVar11 = (bool)((byte)uVar44 & 1);
                auVar54._0_4_ = (uint)bVar11 * auVar45._0_4_ | !bVar11 * auVar52._0_4_;
                bVar11 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar54._4_4_ = (uint)bVar11 * auVar45._4_4_ | !bVar11 * auVar52._4_4_;
                bVar11 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar54._8_4_ = (uint)bVar11 * auVar45._8_4_ | !bVar11 * auVar52._8_4_;
                bVar11 = SUB81(uVar44 >> 3,0);
                auVar54._12_4_ = (uint)bVar11 * auVar45._12_4_ | !bVar11 * auVar52._12_4_;
                auVar45 = vpshufd_avx(auVar54,0xaa);
                auVar50 = vpshufd_avx(auVar53,0xaa);
                uVar44 = vpcmpgtd_avx512vl(auVar45,auVar50);
                uVar44 = uVar44 & 0xf;
                auVar50 = vpblendmd_avx512vl(auVar54,auVar53);
                bVar11 = (bool)((byte)uVar44 & 1);
                auVar55._0_4_ = (uint)bVar11 * auVar50._0_4_ | (uint)!bVar11 * auVar45._0_4_;
                bVar11 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar55._4_4_ = (uint)bVar11 * auVar50._4_4_ | (uint)!bVar11 * auVar45._4_4_;
                bVar11 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar55._8_4_ = (uint)bVar11 * auVar50._8_4_ | (uint)!bVar11 * auVar45._8_4_;
                bVar11 = SUB81(uVar44 >> 3,0);
                auVar55._12_4_ = (uint)bVar11 * auVar50._12_4_ | (uint)!bVar11 * auVar45._12_4_;
                auVar45 = vmovdqa32_avx512vl(auVar54);
                bVar11 = (bool)((byte)uVar44 & 1);
                auVar56._0_4_ = (uint)bVar11 * auVar45._0_4_ | !bVar11 * auVar53._0_4_;
                bVar11 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar11 * auVar45._4_4_ | !bVar11 * auVar53._4_4_;
                bVar11 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar11 * auVar45._8_4_ | !bVar11 * auVar53._8_4_;
                bVar11 = SUB81(uVar44 >> 3,0);
                auVar56._12_4_ = (uint)bVar11 * auVar45._12_4_ | !bVar11 * auVar53._12_4_;
                *pauVar40 = auVar56;
                pauVar40[1] = auVar55;
                pauVar40 = pauVar40 + 2;
              }
              else {
                lVar21 = 0;
                for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                  lVar21 = lVar21 + 1;
                }
                uVar31 = *(uint *)(local_1180 + lVar21 * 4);
                auVar103._8_8_ = 0;
                auVar103._0_8_ = *(ulong *)(uVar41 + lVar21 * 8);
                auVar47 = vpunpcklqdq_avx(auVar103,ZEXT416(uVar31));
                uVar43 = vpcmpgtd_avx512vl(auVar46,auVar51);
                uVar43 = uVar43 & 0xf;
                auVar46 = vpblendmd_avx512vl(auVar50,auVar45);
                bVar11 = (bool)((byte)uVar43 & 1);
                auVar57._0_4_ = (uint)bVar11 * auVar46._0_4_ | (uint)!bVar11 * auVar51._0_4_;
                bVar11 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar57._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar51._4_4_;
                bVar11 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar57._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar51._8_4_;
                bVar11 = SUB81(uVar43 >> 3,0);
                auVar57._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar51._12_4_;
                auVar50 = vmovdqa32_avx512vl(auVar50);
                bVar11 = (bool)((byte)uVar43 & 1);
                auVar58._0_4_ = (uint)bVar11 * auVar50._0_4_ | (uint)!bVar11 * auVar45._0_4_;
                bVar11 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar58._4_4_ = (uint)bVar11 * auVar50._4_4_ | (uint)!bVar11 * auVar45._4_4_;
                bVar11 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar58._8_4_ = (uint)bVar11 * auVar50._8_4_ | (uint)!bVar11 * auVar45._8_4_;
                bVar11 = SUB81(uVar43 >> 3,0);
                auVar58._12_4_ = (uint)bVar11 * auVar50._12_4_ | (uint)!bVar11 * auVar45._12_4_;
                auVar99._4_4_ = uVar31;
                auVar99._0_4_ = uVar31;
                auVar99._8_4_ = uVar31;
                auVar99._12_4_ = uVar31;
                uVar43 = vpcmpgtd_avx512vl(auVar99,auVar48);
                uVar43 = uVar43 & 0xf;
                auVar45 = vpblendmd_avx512vl(auVar47,auVar49);
                bVar11 = (bool)((byte)uVar43 & 1);
                auVar59._0_4_ = (uint)bVar11 * auVar45._0_4_ | !bVar11 * uVar31;
                bVar11 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar59._4_4_ = (uint)bVar11 * auVar45._4_4_ | !bVar11 * uVar31;
                bVar11 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar59._8_4_ = (uint)bVar11 * auVar45._8_4_ | !bVar11 * uVar31;
                bVar11 = SUB81(uVar43 >> 3,0);
                auVar59._12_4_ = (uint)bVar11 * auVar45._12_4_ | !bVar11 * uVar31;
                auVar45 = vmovdqa32_avx512vl(auVar47);
                bVar11 = (bool)((byte)uVar43 & 1);
                auVar60._0_4_ = (uint)bVar11 * auVar45._0_4_ | (uint)!bVar11 * auVar49._0_4_;
                bVar11 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar60._4_4_ = (uint)bVar11 * auVar45._4_4_ | (uint)!bVar11 * auVar49._4_4_;
                bVar11 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar60._8_4_ = (uint)bVar11 * auVar45._8_4_ | (uint)!bVar11 * auVar49._8_4_;
                bVar11 = SUB81(uVar43 >> 3,0);
                auVar60._12_4_ = (uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * auVar49._12_4_;
                auVar45 = vpshufd_avx(auVar60,0xaa);
                auVar50 = vpshufd_avx(auVar58,0xaa);
                uVar43 = vpcmpgtd_avx512vl(auVar45,auVar50);
                uVar43 = uVar43 & 0xf;
                auVar50 = vpblendmd_avx512vl(auVar60,auVar58);
                bVar11 = (bool)((byte)uVar43 & 1);
                auVar61._0_4_ = (uint)bVar11 * auVar50._0_4_ | (uint)!bVar11 * auVar45._0_4_;
                bVar11 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar11 * auVar50._4_4_ | (uint)!bVar11 * auVar45._4_4_;
                bVar11 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar11 * auVar50._8_4_ | (uint)!bVar11 * auVar45._8_4_;
                bVar11 = SUB81(uVar43 >> 3,0);
                auVar61._12_4_ = (uint)bVar11 * auVar50._12_4_ | (uint)!bVar11 * auVar45._12_4_;
                auVar51 = vmovdqa32_avx512vl(auVar60);
                bVar11 = (bool)((byte)uVar43 & 1);
                bVar13 = (bool)((byte)(uVar43 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar43 >> 2) & 1);
                bVar16 = SUB81(uVar43 >> 3,0);
                auVar45 = vpshufd_avx(auVar59,0xaa);
                auVar50 = vpshufd_avx(auVar57,0xaa);
                uVar44 = vpcmpgtd_avx512vl(auVar45,auVar50);
                uVar44 = uVar44 & 0xf;
                auVar50 = vpblendmd_avx512vl(auVar59,auVar57);
                bVar12 = (bool)((byte)uVar44 & 1);
                bVar14 = (bool)((byte)(uVar44 >> 1) & 1);
                uVar43 = CONCAT44((uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar45._4_4_,
                                  (uint)bVar12 * auVar50._0_4_ | (uint)!bVar12 * auVar45._0_4_);
                auVar45 = vmovdqa32_avx512vl(auVar59);
                bVar12 = (bool)((byte)uVar44 & 1);
                auVar62._0_4_ = (uint)bVar12 * auVar45._0_4_ | !bVar12 * auVar57._0_4_;
                bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar62._4_4_ = (uint)bVar12 * auVar45._4_4_ | !bVar12 * auVar57._4_4_;
                bVar12 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar62._8_4_ = (uint)bVar12 * auVar45._8_4_ | !bVar12 * auVar57._8_4_;
                bVar12 = SUB81(uVar44 >> 3,0);
                auVar62._12_4_ = (uint)bVar12 * auVar45._12_4_ | !bVar12 * auVar57._12_4_;
                auVar45 = vpshufd_avx(auVar62,0xaa);
                auVar50 = vpshufd_avx(auVar61,0xaa);
                uVar44 = vpcmpgtd_avx512vl(auVar50,auVar45);
                uVar44 = uVar44 & 0xf;
                auVar50 = vpblendmd_avx512vl(auVar61,auVar62);
                bVar12 = (bool)((byte)uVar44 & 1);
                auVar63._0_4_ = (uint)bVar12 * auVar50._0_4_ | (uint)!bVar12 * auVar45._0_4_;
                bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar12 * auVar50._4_4_ | (uint)!bVar12 * auVar45._4_4_;
                bVar12 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar12 * auVar50._8_4_ | (uint)!bVar12 * auVar45._8_4_;
                bVar12 = SUB81(uVar44 >> 3,0);
                auVar63._12_4_ = (uint)bVar12 * auVar50._12_4_ | (uint)!bVar12 * auVar45._12_4_;
                auVar45 = vmovdqa32_avx512vl(auVar61);
                bVar12 = (bool)((byte)uVar44 & 1);
                auVar64._0_4_ = (uint)bVar12 * auVar45._0_4_ | !bVar12 * auVar62._0_4_;
                bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar64._4_4_ = (uint)bVar12 * auVar45._4_4_ | !bVar12 * auVar62._4_4_;
                bVar12 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar64._8_4_ = (uint)bVar12 * auVar45._8_4_ | !bVar12 * auVar62._8_4_;
                bVar12 = SUB81(uVar44 >> 3,0);
                auVar64._12_4_ = (uint)bVar12 * auVar45._12_4_ | !bVar12 * auVar62._12_4_;
                *(uint *)*pauVar40 = (uint)bVar11 * auVar51._0_4_ | !bVar11 * auVar58._0_4_;
                *(uint *)((long)*pauVar40 + 4) =
                     (uint)bVar13 * auVar51._4_4_ | !bVar13 * auVar58._4_4_;
                *(uint *)((long)*pauVar40 + 8) =
                     (uint)bVar15 * auVar51._8_4_ | !bVar15 * auVar58._8_4_;
                *(uint *)((long)*pauVar40 + 0xc) =
                     (uint)bVar16 * auVar51._12_4_ | !bVar16 * auVar58._12_4_;
                pauVar40[1] = auVar64;
                pauVar40[2] = auVar63;
                pauVar40 = pauVar40 + 3;
              }
            }
          }
        }
        local_12f8 = (ulong)((uint)uVar43 & 0xf) - 8;
        uVar43 = uVar43 & 0xfffffffffffffff0;
        for (local_12f0 = 0; local_12f0 != local_12f8; local_12f0 = local_12f0 + 1) {
          lVar30 = local_12f0 * 0x60;
          local_12e8 = context->scene;
          ppfVar5 = (context->scene->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar43 + 0x48 + lVar30)];
          auVar86._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x28 + lVar30));
          auVar86._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 8 + lVar30));
          pfVar7 = ppfVar5[*(uint *)(uVar43 + 0x40 + lVar30)];
          auVar67._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x20 + lVar30));
          auVar67._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + lVar30));
          pfVar8 = ppfVar5[*(uint *)(uVar43 + 0x4c + lVar30)];
          auVar68._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x2c + lVar30));
          auVar68._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0xc + lVar30));
          pfVar9 = ppfVar5[*(uint *)(uVar43 + 0x44 + lVar30)];
          auVar74._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x24 + lVar30));
          auVar74._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 4 + lVar30));
          lVar21 = uVar43 + 0x40 + lVar30;
          local_fc0 = *(undefined8 *)(lVar21 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar21 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          lVar21 = uVar43 + 0x50 + lVar30;
          local_11a0 = *(undefined8 *)(lVar21 + 0x10);
          uStack_1198 = *(undefined8 *)(lVar21 + 0x18);
          auVar51 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x10 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar43 + 0x18 + lVar30)));
          auVar45 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x10 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar43 + 0x18 + lVar30)));
          auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x14 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar43 + 0x1c + lVar30)));
          auVar50 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x14 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar43 + 0x1c + lVar30)));
          auVar48 = vunpcklps_avx(auVar45,auVar50);
          auVar49 = vunpcklps_avx(auVar51,auVar46);
          auVar45 = vunpckhps_avx(auVar51,auVar46);
          auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x30 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar43 + 0x38 + lVar30)));
          auVar50 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x30 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar43 + 0x38 + lVar30)));
          auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x34 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar43 + 0x3c + lVar30)));
          auVar51 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 0x34 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar43 + 0x3c + lVar30)));
          auVar51 = vunpcklps_avx(auVar50,auVar51);
          auVar100 = vunpcklps_avx(auVar46,auVar47);
          auVar50 = vunpckhps_avx(auVar46,auVar47);
          uStack_1190 = local_11a0;
          uStack_1188 = uStack_1198;
          auVar87 = vunpcklps_avx(auVar74,auVar68);
          auVar84 = vunpcklps_avx(auVar67,auVar86);
          auVar85 = vunpcklps_avx(auVar84,auVar87);
          auVar84 = vunpckhps_avx(auVar84,auVar87);
          auVar87 = vunpckhps_avx(auVar74,auVar68);
          auVar86 = vunpckhps_avx(auVar67,auVar86);
          auVar86 = vunpcklps_avx(auVar86,auVar87);
          auVar70._16_16_ = auVar49;
          auVar70._0_16_ = auVar49;
          auVar73._16_16_ = auVar45;
          auVar73._0_16_ = auVar45;
          auVar71._16_16_ = auVar48;
          auVar71._0_16_ = auVar48;
          auVar75._16_16_ = auVar100;
          auVar75._0_16_ = auVar100;
          auVar76._16_16_ = auVar50;
          auVar76._0_16_ = auVar50;
          uVar94 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar77._4_4_ = uVar94;
          auVar77._0_4_ = uVar94;
          auVar77._8_4_ = uVar94;
          auVar77._12_4_ = uVar94;
          auVar77._16_4_ = uVar94;
          auVar77._20_4_ = uVar94;
          auVar77._24_4_ = uVar94;
          auVar77._28_4_ = uVar94;
          auVar65 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
          auVar66 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
          uVar94 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar101._4_4_ = uVar94;
          auVar101._0_4_ = uVar94;
          auVar101._8_4_ = uVar94;
          auVar101._12_4_ = uVar94;
          auVar101._16_4_ = uVar94;
          auVar101._20_4_ = uVar94;
          auVar101._24_4_ = uVar94;
          auVar101._28_4_ = uVar94;
          auVar72._16_16_ = auVar51;
          auVar72._0_16_ = auVar51;
          uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          auVar105._4_4_ = uVar94;
          auVar105._0_4_ = uVar94;
          auVar105._8_4_ = uVar94;
          auVar105._12_4_ = uVar94;
          auVar105._16_4_ = uVar94;
          auVar105._20_4_ = uVar94;
          auVar105._24_4_ = uVar94;
          auVar105._28_4_ = uVar94;
          fVar107 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar110._4_4_ = fVar107;
          auVar110._0_4_ = fVar107;
          auVar110._8_4_ = fVar107;
          auVar110._12_4_ = fVar107;
          auVar110._16_4_ = fVar107;
          auVar110._20_4_ = fVar107;
          auVar110._24_4_ = fVar107;
          auVar110._28_4_ = fVar107;
          auVar87 = vsubps_avx(auVar85,auVar77);
          auVar67 = vsubps_avx512vl(auVar84,auVar65);
          auVar68 = vsubps_avx512vl(auVar86,auVar66);
          auVar69 = vsubps_avx512vl(auVar70,auVar77);
          auVar70 = vsubps_avx512vl(auVar73,auVar65);
          auVar71 = vsubps_avx512vl(auVar71,auVar66);
          auVar84 = vsubps_avx(auVar75,auVar77);
          auVar65 = vsubps_avx512vl(auVar76,auVar65);
          auVar66 = vsubps_avx512vl(auVar72,auVar66);
          auVar86 = vsubps_avx(auVar84,auVar87);
          auVar85 = vsubps_avx(auVar65,auVar67);
          auVar72 = vsubps_avx512vl(auVar66,auVar68);
          auVar73 = vsubps_avx512vl(auVar87,auVar69);
          auVar74 = vsubps_avx512vl(auVar67,auVar70);
          auVar75 = vsubps_avx512vl(auVar68,auVar71);
          auVar76 = vsubps_avx512vl(auVar69,auVar84);
          auVar77 = vsubps_avx512vl(auVar70,auVar65);
          auVar78 = vsubps_avx512vl(auVar71,auVar66);
          auVar82._0_4_ = auVar84._0_4_ + auVar87._0_4_;
          auVar82._4_4_ = auVar84._4_4_ + auVar87._4_4_;
          auVar82._8_4_ = auVar84._8_4_ + auVar87._8_4_;
          auVar82._12_4_ = auVar84._12_4_ + auVar87._12_4_;
          auVar82._16_4_ = auVar84._16_4_ + auVar87._16_4_;
          auVar82._20_4_ = auVar84._20_4_ + auVar87._20_4_;
          auVar82._24_4_ = auVar84._24_4_ + auVar87._24_4_;
          auVar82._28_4_ = auVar84._28_4_ + auVar87._28_4_;
          auVar104._0_4_ = auVar65._0_4_ + auVar67._0_4_;
          auVar104._4_4_ = auVar65._4_4_ + auVar67._4_4_;
          auVar104._8_4_ = auVar65._8_4_ + auVar67._8_4_;
          auVar104._12_4_ = auVar65._12_4_ + auVar67._12_4_;
          auVar104._16_4_ = auVar65._16_4_ + auVar67._16_4_;
          auVar104._20_4_ = auVar65._20_4_ + auVar67._20_4_;
          auVar104._24_4_ = auVar65._24_4_ + auVar67._24_4_;
          auVar104._28_4_ = auVar65._28_4_ + auVar67._28_4_;
          auVar79 = vaddps_avx512vl(auVar66,auVar68);
          auVar80 = vmulps_avx512vl(auVar104,auVar72);
          auVar80 = vfmsub231ps_avx512vl(auVar80,auVar85,auVar79);
          auVar79 = vmulps_avx512vl(auVar79,auVar86);
          auVar81 = vfmsub231ps_avx512vl(auVar79,auVar72,auVar82);
          auVar79._4_4_ = auVar85._4_4_ * auVar82._4_4_;
          auVar79._0_4_ = auVar85._0_4_ * auVar82._0_4_;
          auVar79._8_4_ = auVar85._8_4_ * auVar82._8_4_;
          auVar79._12_4_ = auVar85._12_4_ * auVar82._12_4_;
          auVar79._16_4_ = auVar85._16_4_ * auVar82._16_4_;
          auVar79._20_4_ = auVar85._20_4_ * auVar82._20_4_;
          auVar79._24_4_ = auVar85._24_4_ * auVar82._24_4_;
          auVar79._28_4_ = auVar82._28_4_;
          auVar45 = vfmsub231ps_fma(auVar79,auVar86,auVar104);
          auVar83._0_4_ = fVar107 * auVar45._0_4_;
          auVar83._4_4_ = fVar107 * auVar45._4_4_;
          auVar83._8_4_ = fVar107 * auVar45._8_4_;
          auVar83._12_4_ = fVar107 * auVar45._12_4_;
          auVar83._16_4_ = fVar107 * 0.0;
          auVar83._20_4_ = fVar107 * 0.0;
          auVar83._24_4_ = fVar107 * 0.0;
          auVar83._28_4_ = 0;
          auVar79 = vfmadd231ps_avx512vl(auVar83,auVar105,auVar81);
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar101,auVar80);
          auVar80 = vaddps_avx512vl(auVar87,auVar69);
          auVar81 = vaddps_avx512vl(auVar67,auVar70);
          auVar82 = vaddps_avx512vl(auVar68,auVar71);
          auVar83 = vmulps_avx512vl(auVar81,auVar75);
          auVar83 = vfmsub231ps_avx512vl(auVar83,auVar74,auVar82);
          auVar82 = vmulps_avx512vl(auVar82,auVar73);
          auVar82 = vfmsub231ps_avx512vl(auVar82,auVar75,auVar80);
          auVar80 = vmulps_avx512vl(auVar80,auVar74);
          auVar81 = vfmsub231ps_avx512vl(auVar80,auVar73,auVar81);
          auVar80._4_4_ = fVar107 * auVar81._4_4_;
          auVar80._0_4_ = fVar107 * auVar81._0_4_;
          auVar80._8_4_ = fVar107 * auVar81._8_4_;
          auVar80._12_4_ = fVar107 * auVar81._12_4_;
          auVar80._16_4_ = fVar107 * auVar81._16_4_;
          auVar80._20_4_ = fVar107 * auVar81._20_4_;
          auVar80._24_4_ = fVar107 * auVar81._24_4_;
          auVar80._28_4_ = auVar81._28_4_;
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar105,auVar82);
          local_1160 = vfmadd231ps_avx512vl(auVar80,auVar101,auVar83);
          auVar84 = vaddps_avx512vl(auVar69,auVar84);
          auVar65 = vaddps_avx512vl(auVar70,auVar65);
          auVar66 = vaddps_avx512vl(auVar71,auVar66);
          auVar80 = vmulps_avx512vl(auVar65,auVar78);
          auVar80 = vfmsub231ps_avx512vl(auVar80,auVar77,auVar66);
          auVar66 = vmulps_avx512vl(auVar66,auVar76);
          auVar66 = vfmsub231ps_avx512vl(auVar66,auVar78,auVar84);
          auVar69._4_4_ = auVar84._4_4_ * auVar77._4_4_;
          auVar69._0_4_ = auVar84._0_4_ * auVar77._0_4_;
          auVar69._8_4_ = auVar84._8_4_ * auVar77._8_4_;
          auVar69._12_4_ = auVar84._12_4_ * auVar77._12_4_;
          auVar69._16_4_ = auVar84._16_4_ * auVar77._16_4_;
          auVar69._20_4_ = auVar84._20_4_ * auVar77._20_4_;
          auVar69._24_4_ = auVar84._24_4_ * auVar77._24_4_;
          auVar69._28_4_ = auVar84._28_4_;
          auVar45 = vfmsub231ps_fma(auVar69,auVar76,auVar65);
          auVar84 = vmulps_avx512vl(auVar110,ZEXT1632(auVar45));
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar105,auVar66);
          auVar80 = vfmadd231ps_avx512vl(auVar84,auVar101,auVar80);
          auVar81._0_4_ = auVar79._0_4_ + local_1160._0_4_;
          auVar81._4_4_ = auVar79._4_4_ + local_1160._4_4_;
          auVar81._8_4_ = auVar79._8_4_ + local_1160._8_4_;
          auVar81._12_4_ = auVar79._12_4_ + local_1160._12_4_;
          auVar81._16_4_ = auVar79._16_4_ + local_1160._16_4_;
          auVar81._20_4_ = auVar79._20_4_ + local_1160._20_4_;
          auVar81._24_4_ = auVar79._24_4_ + local_1160._24_4_;
          auVar81._28_4_ = auVar79._28_4_ + local_1160._28_4_;
          local_1140 = vaddps_avx512vl(auVar80,auVar81);
          auVar84._8_4_ = 0x7fffffff;
          auVar84._0_8_ = 0x7fffffff7fffffff;
          auVar84._12_4_ = 0x7fffffff;
          auVar84._16_4_ = 0x7fffffff;
          auVar84._20_4_ = 0x7fffffff;
          auVar84._24_4_ = 0x7fffffff;
          auVar84._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_1140,auVar84);
          auVar65._8_4_ = 0x34000000;
          auVar65._0_8_ = 0x3400000034000000;
          auVar65._12_4_ = 0x34000000;
          auVar65._16_4_ = 0x34000000;
          auVar65._20_4_ = 0x34000000;
          auVar65._24_4_ = 0x34000000;
          auVar65._28_4_ = 0x34000000;
          auVar84 = vmulps_avx512vl(local_1140,auVar65);
          auVar65 = vminps_avx512vl(auVar79,local_1160);
          auVar65 = vminps_avx512vl(auVar65,auVar80);
          auVar66._8_4_ = 0x80000000;
          auVar66._0_8_ = 0x8000000080000000;
          auVar66._12_4_ = 0x80000000;
          auVar66._16_4_ = 0x80000000;
          auVar66._20_4_ = 0x80000000;
          auVar66._24_4_ = 0x80000000;
          auVar66._28_4_ = 0x80000000;
          auVar66 = vxorps_avx512vl(auVar84,auVar66);
          uVar17 = vcmpps_avx512vl(auVar65,auVar66,5);
          auVar65 = vmaxps_avx512vl(auVar79,local_1160);
          auVar65 = vmaxps_avx512vl(auVar65,auVar80);
          uVar18 = vcmpps_avx512vl(auVar65,auVar84,2);
          local_10c0 = (byte)uVar17 | (byte)uVar18;
          if (local_10c0 != 0) {
            auVar84 = vmulps_avx512vl(auVar72,auVar74);
            auVar65 = vmulps_avx512vl(auVar86,auVar75);
            auVar66 = vmulps_avx512vl(auVar85,auVar73);
            auVar80 = vmulps_avx512vl(auVar75,auVar77);
            auVar69 = vmulps_avx512vl(auVar73,auVar78);
            auVar70 = vmulps_avx512vl(auVar74,auVar76);
            auVar85 = vfmsub213ps_avx512vl(auVar85,auVar75,auVar84);
            auVar71 = vfmsub213ps_avx512vl(auVar72,auVar73,auVar65);
            auVar86 = vfmsub213ps_avx512vl(auVar86,auVar74,auVar66);
            auVar72 = vfmsub213ps_avx512vl(auVar78,auVar74,auVar80);
            auVar74 = vfmsub213ps_avx512vl(auVar76,auVar75,auVar69);
            auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar70);
            auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar84,auVar75);
            vandps_avx512vl(auVar80,auVar75);
            uVar44 = vcmpps_avx512vl(auVar75,auVar75,1);
            vandps_avx512vl(auVar65,auVar75);
            vandps_avx512vl(auVar69,auVar75);
            uVar41 = vcmpps_avx512vl(auVar75,auVar75,1);
            vandps_avx512vl(auVar66,auVar75);
            vandps_avx512vl(auVar70,auVar75);
            uVar32 = vcmpps_avx512vl(auVar75,auVar75,1);
            bVar11 = (bool)((byte)uVar44 & 1);
            local_1120._0_4_ = (float)((uint)bVar11 * auVar85._0_4_ | (uint)!bVar11 * auVar72._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar44 >> 1) & 1);
            local_1120._4_4_ = (float)((uint)bVar11 * auVar85._4_4_ | (uint)!bVar11 * auVar72._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar44 >> 2) & 1);
            local_1120._8_4_ = (float)((uint)bVar11 * auVar85._8_4_ | (uint)!bVar11 * auVar72._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar44 >> 3) & 1);
            local_1120._12_4_ =
                 (float)((uint)bVar11 * auVar85._12_4_ | (uint)!bVar11 * auVar72._12_4_);
            bVar11 = (bool)((byte)(uVar44 >> 4) & 1);
            local_1120._16_4_ =
                 (float)((uint)bVar11 * auVar85._16_4_ | (uint)!bVar11 * auVar72._16_4_);
            bVar11 = (bool)((byte)(uVar44 >> 5) & 1);
            local_1120._20_4_ =
                 (float)((uint)bVar11 * auVar85._20_4_ | (uint)!bVar11 * auVar72._20_4_);
            bVar11 = (bool)((byte)(uVar44 >> 6) & 1);
            local_1120._24_4_ =
                 (float)((uint)bVar11 * auVar85._24_4_ | (uint)!bVar11 * auVar72._24_4_);
            bVar11 = SUB81(uVar44 >> 7,0);
            local_1120._28_4_ = (uint)bVar11 * auVar85._28_4_ | (uint)!bVar11 * auVar72._28_4_;
            bVar11 = (bool)((byte)uVar41 & 1);
            local_1100._0_4_ = (float)((uint)bVar11 * auVar71._0_4_ | (uint)!bVar11 * auVar74._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar41 >> 1) & 1);
            local_1100._4_4_ = (float)((uint)bVar11 * auVar71._4_4_ | (uint)!bVar11 * auVar74._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar41 >> 2) & 1);
            local_1100._8_4_ = (float)((uint)bVar11 * auVar71._8_4_ | (uint)!bVar11 * auVar74._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar41 >> 3) & 1);
            local_1100._12_4_ =
                 (float)((uint)bVar11 * auVar71._12_4_ | (uint)!bVar11 * auVar74._12_4_);
            bVar11 = (bool)((byte)(uVar41 >> 4) & 1);
            local_1100._16_4_ =
                 (float)((uint)bVar11 * auVar71._16_4_ | (uint)!bVar11 * auVar74._16_4_);
            bVar11 = (bool)((byte)(uVar41 >> 5) & 1);
            local_1100._20_4_ =
                 (float)((uint)bVar11 * auVar71._20_4_ | (uint)!bVar11 * auVar74._20_4_);
            bVar11 = (bool)((byte)(uVar41 >> 6) & 1);
            local_1100._24_4_ =
                 (float)((uint)bVar11 * auVar71._24_4_ | (uint)!bVar11 * auVar74._24_4_);
            bVar11 = SUB81(uVar41 >> 7,0);
            local_1100._28_4_ = (uint)bVar11 * auVar71._28_4_ | (uint)!bVar11 * auVar74._28_4_;
            bVar11 = (bool)((byte)uVar32 & 1);
            local_10e0 = (float)((uint)bVar11 * auVar86._0_4_ | (uint)!bVar11 * auVar73._0_4_);
            bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
            fStack_10dc = (float)((uint)bVar11 * auVar86._4_4_ | (uint)!bVar11 * auVar73._4_4_);
            bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
            fStack_10d8 = (float)((uint)bVar11 * auVar86._8_4_ | (uint)!bVar11 * auVar73._8_4_);
            bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
            fStack_10d4 = (float)((uint)bVar11 * auVar86._12_4_ | (uint)!bVar11 * auVar73._12_4_);
            bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
            fStack_10d0 = (float)((uint)bVar11 * auVar86._16_4_ | (uint)!bVar11 * auVar73._16_4_);
            bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
            fStack_10cc = (float)((uint)bVar11 * auVar86._20_4_ | (uint)!bVar11 * auVar73._20_4_);
            bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
            fStack_10c8 = (float)((uint)bVar11 * auVar86._24_4_ | (uint)!bVar11 * auVar73._24_4_);
            bVar11 = SUB81(uVar32 >> 7,0);
            uStack_10c4 = (uint)bVar11 * auVar86._28_4_ | (uint)!bVar11 * auVar73._28_4_;
            auVar25._4_4_ = fVar107 * fStack_10dc;
            auVar25._0_4_ = fVar107 * local_10e0;
            auVar25._8_4_ = fVar107 * fStack_10d8;
            auVar25._12_4_ = fVar107 * fStack_10d4;
            auVar25._16_4_ = fVar107 * fStack_10d0;
            auVar25._20_4_ = fVar107 * fStack_10cc;
            auVar25._24_4_ = fVar107 * fStack_10c8;
            auVar25._28_4_ = fVar107;
            auVar45 = vfmadd213ps_fma(auVar105,local_1100,auVar25);
            auVar45 = vfmadd213ps_fma(auVar101,local_1120,ZEXT1632(auVar45));
            auVar86 = ZEXT1632(CONCAT412(auVar45._12_4_ + auVar45._12_4_,
                                         CONCAT48(auVar45._8_4_ + auVar45._8_4_,
                                                  CONCAT44(auVar45._4_4_ + auVar45._4_4_,
                                                           auVar45._0_4_ + auVar45._0_4_))));
            auVar106._0_4_ = auVar68._0_4_ * local_10e0;
            auVar106._4_4_ = auVar68._4_4_ * fStack_10dc;
            auVar106._8_4_ = auVar68._8_4_ * fStack_10d8;
            auVar106._12_4_ = auVar68._12_4_ * fStack_10d4;
            auVar106._16_4_ = auVar68._16_4_ * fStack_10d0;
            auVar106._20_4_ = auVar68._20_4_ * fStack_10cc;
            auVar106._24_4_ = auVar68._24_4_ * fStack_10c8;
            auVar106._28_4_ = 0;
            auVar45 = vfmadd213ps_fma(auVar67,local_1100,auVar106);
            auVar50 = vfmadd213ps_fma(auVar87,local_1120,ZEXT1632(auVar45));
            auVar84 = vrcp14ps_avx512vl(auVar86);
            auVar87._8_4_ = 0x3f800000;
            auVar87._0_8_ = 0x3f8000003f800000;
            auVar87._12_4_ = 0x3f800000;
            auVar87._16_4_ = 0x3f800000;
            auVar87._20_4_ = 0x3f800000;
            auVar87._24_4_ = 0x3f800000;
            auVar87._28_4_ = 0x3f800000;
            auVar87 = vfnmadd213ps_avx512vl(auVar84,auVar86,auVar87);
            auVar45 = vfmadd132ps_fma(auVar87,auVar84,auVar84);
            local_1060 = ZEXT1632(CONCAT412(auVar45._12_4_ * (auVar50._12_4_ + auVar50._12_4_),
                                            CONCAT48(auVar45._8_4_ * (auVar50._8_4_ + auVar50._8_4_)
                                                     ,CONCAT44(auVar45._4_4_ *
                                                               (auVar50._4_4_ + auVar50._4_4_),
                                                               auVar45._0_4_ *
                                                               (auVar50._0_4_ + auVar50._0_4_)))));
            auVar93 = ZEXT3264(local_1060);
            uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar85._4_4_ = uVar94;
            auVar85._0_4_ = uVar94;
            auVar85._8_4_ = uVar94;
            auVar85._12_4_ = uVar94;
            auVar85._16_4_ = uVar94;
            auVar85._20_4_ = uVar94;
            auVar85._24_4_ = uVar94;
            auVar85._28_4_ = uVar94;
            uVar17 = vcmpps_avx512vl(local_1060,auVar85,0xd);
            auVar78._8_4_ = 0x80000000;
            auVar78._0_8_ = 0x8000000080000000;
            auVar78._12_4_ = 0x80000000;
            auVar78._16_4_ = 0x80000000;
            auVar78._20_4_ = 0x80000000;
            auVar78._24_4_ = 0x80000000;
            auVar78._28_4_ = 0x80000000;
            auVar87 = vxorps_avx512vl(auVar86,auVar78);
            fVar107 = (ray->super_RayK<1>).tfar;
            auVar22._4_4_ = fVar107;
            auVar22._0_4_ = fVar107;
            auVar22._8_4_ = fVar107;
            auVar22._12_4_ = fVar107;
            auVar22._16_4_ = fVar107;
            auVar22._20_4_ = fVar107;
            auVar22._24_4_ = fVar107;
            auVar22._28_4_ = fVar107;
            uVar18 = vcmpps_avx512vl(local_1060,auVar22,2);
            uVar19 = vcmpps_avx512vl(auVar86,auVar87,4);
            local_10c0 = (byte)uVar17 & (byte)uVar18 & (byte)uVar19 & local_10c0;
            uVar31 = (uint)local_10c0;
            if (local_10c0 != 0) {
              auVar87 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar111 = ZEXT3264(auVar87);
              uVar29 = vextractps_avx(auVar87._0_16_,1);
              local_1180 = auVar79;
              local_fe0 = 0xf0;
              auVar23._8_4_ = 0x219392ef;
              auVar23._0_8_ = 0x219392ef219392ef;
              auVar23._12_4_ = 0x219392ef;
              auVar23._16_4_ = 0x219392ef;
              auVar23._20_4_ = 0x219392ef;
              auVar23._24_4_ = 0x219392ef;
              auVar23._28_4_ = 0x219392ef;
              uVar39 = vcmpps_avx512vl(local_1140,auVar23,5);
              auVar84 = vrcp14ps_avx512vl(local_1140);
              auVar102._8_4_ = 0x3f800000;
              auVar102._0_8_ = 0x3f8000003f800000;
              auVar102._12_4_ = 0x3f800000;
              auVar102._16_4_ = 0x3f800000;
              auVar102._20_4_ = 0x3f800000;
              auVar102._24_4_ = 0x3f800000;
              auVar102._28_4_ = 0x3f800000;
              auVar45 = vfnmadd213ps_fma(local_1140,auVar84,auVar102);
              auVar87 = vfmadd132ps_avx512vl(ZEXT1632(auVar45),auVar84,auVar84);
              fVar108 = (float)((uint)((byte)uVar39 & 1) * auVar87._0_4_);
              fVar107 = (float)((uint)((byte)(uVar39 >> 1) & 1) * auVar87._4_4_);
              fVar109 = (float)((uint)((byte)(uVar39 >> 2) & 1) * auVar87._8_4_);
              fVar1 = (float)((uint)((byte)(uVar39 >> 3) & 1) * auVar87._12_4_);
              fVar2 = (float)((uint)((byte)(uVar39 >> 4) & 1) * auVar87._16_4_);
              fVar3 = (float)((uint)((byte)(uVar39 >> 5) & 1) * auVar87._20_4_);
              fVar90 = (float)((uint)((byte)(uVar39 >> 6) & 1) * auVar87._24_4_);
              auVar26._4_4_ = fVar107 * auVar79._4_4_;
              auVar26._0_4_ = fVar108 * auVar79._0_4_;
              auVar26._8_4_ = fVar109 * auVar79._8_4_;
              auVar26._12_4_ = fVar1 * auVar79._12_4_;
              auVar26._16_4_ = fVar2 * auVar79._16_4_;
              auVar26._20_4_ = fVar3 * auVar79._20_4_;
              auVar26._24_4_ = fVar90 * auVar79._24_4_;
              auVar26._28_4_ = auVar79._28_4_;
              auVar87 = vminps_avx(auVar26,auVar102);
              auVar27._4_4_ = fVar107 * local_1160._4_4_;
              auVar27._0_4_ = fVar108 * local_1160._0_4_;
              auVar27._8_4_ = fVar109 * local_1160._8_4_;
              auVar27._12_4_ = fVar1 * local_1160._12_4_;
              auVar27._16_4_ = fVar2 * local_1160._16_4_;
              auVar27._20_4_ = fVar3 * local_1160._20_4_;
              auVar27._24_4_ = fVar90 * local_1160._24_4_;
              auVar27._28_4_ = auVar84._28_4_;
              auVar84 = vminps_avx(auVar27,auVar102);
              auVar86 = vsubps_avx(auVar102,auVar87);
              auVar85 = vsubps_avx(auVar102,auVar84);
              local_1080 = vblendps_avx(auVar84,auVar86,0xf0);
              local_10a0 = vblendps_avx(auVar87,auVar85,0xf0);
              fVar107 = (float)DAT_01fbac00;
              fVar108 = DAT_01fbac00._4_4_;
              fVar109 = DAT_01fbac00._8_4_;
              fVar90 = DAT_01fbac00._12_4_;
              fVar3 = DAT_01fbac00._16_4_;
              fVar1 = DAT_01fbac00._20_4_;
              fVar2 = DAT_01fbac00._24_4_;
              local_1040[0] = local_1120._0_4_ * fVar107;
              local_1040[1] = local_1120._4_4_ * fVar108;
              local_1040[2] = local_1120._8_4_ * fVar109;
              local_1040[3] = local_1120._12_4_ * fVar90;
              fStack_1030 = local_1120._16_4_ * fVar3;
              fStack_102c = local_1120._20_4_ * fVar1;
              fStack_1028 = local_1120._24_4_ * fVar2;
              uStack_1024 = local_1120._28_4_;
              local_1020[0] = local_1100._0_4_ * fVar107;
              local_1020[1] = local_1100._4_4_ * fVar108;
              local_1020[2] = local_1100._8_4_ * fVar109;
              local_1020[3] = local_1100._12_4_ * fVar90;
              fStack_1010 = local_1100._16_4_ * fVar3;
              fStack_100c = local_1100._20_4_ * fVar1;
              fStack_1008 = local_1100._24_4_ * fVar2;
              uStack_1004 = local_1100._28_4_;
              local_1000[0] = local_10e0 * fVar107;
              local_1000[1] = fStack_10dc * fVar108;
              local_1000[2] = fStack_10d8 * fVar109;
              local_1000[3] = fStack_10d4 * fVar90;
              fStack_ff0 = fStack_10d0 * fVar3;
              fStack_fec = fStack_10cc * fVar1;
              fStack_fe8 = fStack_10c8 * fVar2;
              uStack_fe4 = uStack_10c4;
              auVar91._8_4_ = 0x7f800000;
              auVar91._0_8_ = 0x7f8000007f800000;
              auVar91._12_4_ = 0x7f800000;
              auVar91._16_4_ = 0x7f800000;
              auVar91._20_4_ = 0x7f800000;
              auVar91._24_4_ = 0x7f800000;
              auVar91._28_4_ = 0x7f800000;
              auVar87 = vblendmps_avx512vl(auVar91,local_1060);
              auVar88._0_4_ =
                   (uint)(local_10c0 & 1) * auVar87._0_4_ |
                   (uint)!(bool)(local_10c0 & 1) * 0x7f800000;
              bVar11 = (bool)(local_10c0 >> 1 & 1);
              auVar88._4_4_ = (uint)bVar11 * auVar87._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(local_10c0 >> 2 & 1);
              auVar88._8_4_ = (uint)bVar11 * auVar87._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(local_10c0 >> 3 & 1);
              auVar88._12_4_ = (uint)bVar11 * auVar87._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(local_10c0 >> 4 & 1);
              auVar88._16_4_ = (uint)bVar11 * auVar87._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(local_10c0 >> 5 & 1);
              auVar88._20_4_ = (uint)bVar11 * auVar87._20_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(local_10c0 >> 6 & 1);
              auVar88._24_4_ = (uint)bVar11 * auVar87._24_4_ | (uint)!bVar11 * 0x7f800000;
              auVar88._28_4_ =
                   (uint)(local_10c0 >> 7) * auVar87._28_4_ |
                   (uint)!(bool)(local_10c0 >> 7) * 0x7f800000;
              auVar87 = vshufps_avx(auVar88,auVar88,0xb1);
              auVar87 = vminps_avx(auVar88,auVar87);
              auVar84 = vshufpd_avx(auVar87,auVar87,5);
              auVar87 = vminps_avx(auVar87,auVar84);
              auVar84 = vpermpd_avx2(auVar87,0x4e);
              auVar87 = vminps_avx(auVar87,auVar84);
              uVar17 = vcmpps_avx512vl(auVar88,auVar87,0);
              bVar33 = (byte)uVar17 & local_10c0;
              do {
                uVar38 = uVar31;
                if (bVar33 != 0) {
                  uVar38 = (uint)bVar33;
                }
                uVar20 = 0;
                for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                  uVar20 = uVar20 + 1;
                }
                uVar38 = uVar20 & 0xff;
                local_1298 = *(uint *)((long)&local_fc0 + (ulong)uVar38 * 4);
                pGVar10 = (local_12e8->geometries).items[local_1298].ptr;
                if ((pGVar10->mask & uVar29) == 0) {
                  uVar31 = (uint)(byte)(~(byte)(1 << (uVar20 & 0x1f)) & (byte)uVar31);
                }
                else {
                  pRVar35 = context->args;
                  local_11e0 = auVar111._0_32_;
                  if (pRVar35->filter == (RTCFilterFunctionN)0x0) {
                    local_12e0.context = context->user;
                    if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      uVar39 = (ulong)(uVar38 << 2);
                      fVar107 = *(float *)(local_10a0 + uVar39);
                      fVar108 = *(float *)(local_1080 + uVar39);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar39);
                      (ray->Ng).field_0.field_0.x = *(float *)((long)local_1040 + uVar39);
                      (ray->Ng).field_0.field_0.y = *(float *)((long)local_1020 + uVar39);
                      (ray->Ng).field_0.field_0.z = *(float *)((long)local_1000 + uVar39);
                      ray->u = fVar107;
                      ray->v = fVar108;
                      ray->primID = *(uint *)((long)&local_11a0 + uVar39);
                      ray->geomID = local_1298;
                      ray->instID[0] = (local_12e0.context)->instID[0];
                      ray->instPrimID[0] = (local_12e0.context)->instPrimID[0];
                      uVar39 = local_1308;
                      break;
                    }
                  }
                  else {
                    local_12e0.context = context->user;
                  }
                  uVar39 = (ulong)(uVar38 * 4);
                  local_12b0 = *(float *)((long)local_1040 + uVar39);
                  local_12ac = *(undefined4 *)((long)local_1020 + uVar39);
                  local_12a8 = *(undefined4 *)((long)local_1000 + uVar39);
                  local_12a4 = *(undefined4 *)(local_10a0 + uVar39);
                  local_12a0 = *(undefined4 *)(local_1080 + uVar39);
                  local_129c = *(undefined4 *)((long)&local_11a0 + uVar39);
                  local_1294 = (local_12e0.context)->instID[0];
                  local_1290 = (local_12e0.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar39);
                  local_1324 = -1;
                  local_12e0.valid = &local_1324;
                  local_12e0.geometryUserPtr = pGVar10->userPtr;
                  local_12e0.ray = (RTCRayN *)ray;
                  local_12e0.hit = (RTCHitN *)&local_12b0;
                  local_12e0.N = 1;
                  local_11c0 = auVar93._0_32_;
                  if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01be31ae:
                    if ((pRVar35->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar35->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar35->filter)(&local_12e0);
                      auVar93 = ZEXT3264(local_11c0);
                      auVar119 = ZEXT1664(local_1280);
                      auVar118 = ZEXT1664(local_1270);
                      auVar117 = ZEXT1664(local_1260);
                      auVar116 = ZEXT1664(local_1250);
                      auVar115 = ZEXT1664(local_1240);
                      auVar114 = ZEXT1664(local_1230);
                      ray = local_1310;
                      uVar36 = local_1318;
                      uVar37 = local_1320;
                      if (*local_12e0.valid == 0) goto LAB_01be328a;
                    }
                    (((Vec3f *)((long)local_12e0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_12e0.hit;
                    (((Vec3f *)((long)local_12e0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_12e0.hit + 4);
                    (((Vec3f *)((long)local_12e0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_12e0.hit + 8);
                    *(float *)((long)local_12e0.ray + 0x3c) = *(float *)(local_12e0.hit + 0xc);
                    *(float *)((long)local_12e0.ray + 0x40) = *(float *)(local_12e0.hit + 0x10);
                    *(float *)((long)local_12e0.ray + 0x44) = *(float *)(local_12e0.hit + 0x14);
                    *(float *)((long)local_12e0.ray + 0x48) = *(float *)(local_12e0.hit + 0x18);
                    *(float *)((long)local_12e0.ray + 0x4c) = *(float *)(local_12e0.hit + 0x1c);
                    *(float *)((long)local_12e0.ray + 0x50) = *(float *)(local_12e0.hit + 0x20);
                  }
                  else {
                    local_1300 = pRVar35;
                    (*pGVar10->intersectionFilterN)(&local_12e0);
                    auVar93 = ZEXT3264(local_11c0);
                    auVar119 = ZEXT1664(local_1280);
                    auVar118 = ZEXT1664(local_1270);
                    auVar117 = ZEXT1664(local_1260);
                    auVar116 = ZEXT1664(local_1250);
                    auVar115 = ZEXT1664(local_1240);
                    auVar114 = ZEXT1664(local_1230);
                    pRVar35 = local_1300;
                    ray = local_1310;
                    uVar36 = local_1318;
                    uVar37 = local_1320;
                    if (*local_12e0.valid != 0) goto LAB_01be31ae;
LAB_01be328a:
                    (local_1310->super_RayK<1>).tfar = (float)local_11e0._0_4_;
                    ray = local_1310;
                    uVar36 = local_1318;
                    uVar37 = local_1320;
                  }
                  fVar107 = (ray->super_RayK<1>).tfar;
                  auVar24._4_4_ = fVar107;
                  auVar24._0_4_ = fVar107;
                  auVar24._8_4_ = fVar107;
                  auVar24._12_4_ = fVar107;
                  auVar24._16_4_ = fVar107;
                  auVar24._20_4_ = fVar107;
                  auVar24._24_4_ = fVar107;
                  auVar24._28_4_ = fVar107;
                  uVar17 = vcmpps_avx512vl(auVar93._0_32_,auVar24,2);
                  uVar31 = (uint)(byte)(~(byte)(1 << (uVar20 & 0x1f)) & (byte)uVar31) & (uint)uVar17
                  ;
                  uVar29 = (ray->super_RayK<1>).mask;
                  auVar111 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                }
                bVar33 = (byte)uVar31;
                uVar39 = local_1308;
                if (bVar33 == 0) break;
                auVar92._8_4_ = 0x7f800000;
                auVar92._0_8_ = 0x7f8000007f800000;
                auVar92._12_4_ = 0x7f800000;
                auVar92._16_4_ = 0x7f800000;
                auVar92._20_4_ = 0x7f800000;
                auVar92._24_4_ = 0x7f800000;
                auVar92._28_4_ = 0x7f800000;
                auVar87 = vblendmps_avx512vl(auVar92,auVar93._0_32_);
                auVar89._0_4_ =
                     (uint)(bVar33 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar33 & 1) * 0x7f800000;
                bVar11 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar89._4_4_ = (uint)bVar11 * auVar87._4_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar89._8_4_ = (uint)bVar11 * auVar87._8_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar89._12_4_ = (uint)bVar11 * auVar87._12_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar31 >> 4) & 1);
                auVar89._16_4_ = (uint)bVar11 * auVar87._16_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar31 >> 5) & 1);
                auVar89._20_4_ = (uint)bVar11 * auVar87._20_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar31 >> 6) & 1);
                auVar89._24_4_ = (uint)bVar11 * auVar87._24_4_ | (uint)!bVar11 * 0x7f800000;
                auVar89._28_4_ =
                     (uVar31 >> 7) * auVar87._28_4_ | (uint)!SUB41(uVar31 >> 7,0) * 0x7f800000;
                auVar87 = vshufps_avx(auVar89,auVar89,0xb1);
                auVar87 = vminps_avx(auVar89,auVar87);
                auVar84 = vshufpd_avx(auVar87,auVar87,5);
                auVar87 = vminps_avx(auVar87,auVar84);
                auVar84 = vpermpd_avx2(auVar87,0x4e);
                auVar87 = vminps_avx(auVar87,auVar84);
                uVar17 = vcmpps_avx512vl(auVar89,auVar87,0);
                bVar33 = (byte)uVar17 & bVar33;
              } while( true );
            }
          }
          auVar111 = ZEXT1664(local_1200);
          auVar112 = ZEXT1664(local_1210);
          auVar113 = ZEXT1664(local_1220);
          fVar90 = local_11f0;
          fVar107 = fStack_11ec;
          fVar108 = fStack_11e8;
          fVar109 = fStack_11e4;
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar93 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
      }
      goto LAB_01be26f2;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }